

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.cpp
# Opt level: O1

uint __thiscall irr::CIrrDeviceSDL::sleep(CIrrDeviceSDL *this,uint __seconds)

{
  ITimer *pIVar1;
  char cVar2;
  uint uVar4;
  char in_DL;
  int iVar3;
  
  pIVar1 = (this->super_CIrrDeviceStub).Timer;
  if (pIVar1 == (ITimer *)0x0) {
    cVar2 = '\x01';
  }
  else {
    iVar3 = (*pIVar1->_vptr_ITimer[7])();
    cVar2 = (char)iVar3;
  }
  if (in_DL != '\x01' || cVar2 != '\0') {
    uVar4 = SDL_Delay(__seconds);
    return uVar4;
  }
  (*((this->super_CIrrDeviceStub).Timer)->_vptr_ITimer[3])();
  SDL_Delay(__seconds);
  uVar4 = (*((this->super_CIrrDeviceStub).Timer)->_vptr_ITimer[4])();
  return uVar4;
}

Assistant:

void CIrrDeviceSDL::sleep(u32 timeMs, bool pauseTimer)
{
	const bool wasStopped = Timer ? Timer->isStopped() : true;
	if (pauseTimer && !wasStopped)
		Timer->stop();

	SDL_Delay(timeMs);

	if (pauseTimer && !wasStopped)
		Timer->start();
}